

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  int *iStart;
  BYTE *pBVar4;
  BYTE *pBVar5;
  ulong *puVar6;
  undefined8 *puVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  U32 *pUVar12;
  ulong *mEnd;
  U32 *pUVar13;
  U32 *pUVar14;
  bool bVar15;
  uint uVar16;
  undefined8 uVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  int iVar22;
  ulong *puVar23;
  size_t sVar24;
  int *piVar25;
  int *piVar26;
  seqDef **ppsVar27;
  seqDef *psVar28;
  byte bVar29;
  byte bVar30;
  U32 UVar31;
  int *piVar32;
  ulong *puVar33;
  ulong *puVar34;
  long lVar35;
  ZSTD_matchState_t *pZVar36;
  uint uVar37;
  ulong *puVar39;
  ulong *puVar40;
  ulong *puVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar46;
  uint uVar47;
  BYTE *pBVar48;
  int iVar49;
  undefined1 *puVar50;
  uint uVar51;
  BYTE *litEnd;
  ulong *puVar52;
  uint uVar53;
  ulong uVar54;
  U32 UVar55;
  BYTE *litEnd_3;
  BYTE *iend;
  U32 prefixLowestIndex;
  BYTE *prefixLowest;
  BYTE *dictEnd;
  BYTE *ilimit;
  BYTE *pInLoopLimit;
  BYTE *base;
  BYTE *litLimit_w;
  U32 dictStartIndex;
  U32 dictIndexDelta;
  BYTE *dictBase;
  BYTE *pInLoopLimit_1;
  BYTE *dictStart;
  U32 *hashLong;
  BYTE *litLimit_w_3;
  U32 *hashSmall;
  U32 *dictHashLong;
  U32 *dictHashSmall;
  uint local_154;
  ulong *local_150;
  uint local_144;
  BYTE *local_130;
  BYTE *local_108;
  uint local_70;
  ulong uVar38;
  
  pBVar9 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar49 = (int)pBVar9;
  uVar43 = (int)iEnd - iVar49;
  uVar53 = (ms->window).dictLimit;
  uVar47 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar16 = uVar43 - uVar47;
  if (uVar43 - uVar53 <= uVar47) {
    uVar16 = uVar53;
  }
  pZVar36 = ms->dictMatchState;
  uVar8 = (pZVar36->window).dictLimit;
  pBVar10 = (pZVar36->window).base;
  piVar32 = (int *)(pBVar10 + uVar8);
  iStart = (int *)(pBVar9 + uVar16);
  uVar47 = uVar47 + uVar53;
  uVar53 = (ms->cParams).minMatch;
  pUVar11 = ms->hashTable;
  pUVar12 = ms->chainTable;
  puVar6 = (ulong *)((long)src + (srcSize - 8));
  mEnd = (ulong *)(pZVar36->window).nextSrc;
  uVar37 = ((int)pBVar10 - (int)mEnd) + uVar16;
  uVar38 = (ulong)uVar37;
  pUVar13 = pZVar36->hashTable;
  pUVar14 = pZVar36->chainTable;
  uVar45 = ((int)src - ((int)piVar32 + (int)iStart)) + (int)mEnd;
  local_154 = *rep;
  local_144 = rep[1];
  cVar18 = (char)(ms->cParams).hashLog;
  cVar19 = (char)(ms->cParams).chainLog;
  cVar20 = (char)(pZVar36->cParams).hashLog;
  cVar21 = (char)(pZVar36->cParams).chainLog;
  local_150 = (ulong *)src;
  if (uVar53 == 5) {
    if (uVar43 <= uVar47) {
      if (local_154 <= uVar45) {
        puVar52 = (ulong *)((long)src + (ulong)(uVar45 == 0));
        if (local_144 <= uVar45) {
          if (puVar52 < puVar6) {
            bVar29 = 0x40 - cVar18;
            bVar30 = 0x40 - cVar19;
            puVar1 = (ulong *)((long)iEnd + -7);
            puVar2 = (ulong *)((long)iEnd + -3);
            puVar3 = (ulong *)((long)iEnd + -1);
            puVar23 = iEnd + -4;
            ppsVar27 = &seqStore->sequences;
            pBVar5 = pBVar9 + -1;
            local_130 = pBVar5;
LAB_0014126d:
            uVar54 = *puVar52;
            uVar42 = uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
            uVar44 = uVar54 * -0x30e4432345000000 >> (bVar30 & 0x3f);
            UVar55 = (int)puVar52 - iVar49;
            uVar53 = pUVar11[uVar42];
            UVar31 = UVar55 + 1;
            uVar43 = UVar31 - local_154;
            piVar25 = (int *)(pBVar9 + uVar43);
            if (uVar43 < uVar16) {
              piVar25 = (int *)(pBVar10 + (uVar43 - uVar37));
            }
            local_70 = pUVar12[uVar44];
            pUVar12[uVar44] = UVar55;
            pUVar11[uVar42] = UVar55;
            if ((0xfffffffc < uVar43 - uVar16) || (*piVar25 != *(int *)((long)puVar52 + 1))) {
              if (uVar16 < uVar53) {
                puVar33 = (ulong *)(pBVar9 + uVar53);
                puVar34 = puVar52;
                if (*puVar33 != uVar54) {
LAB_0014173f:
                  if (uVar16 < local_70) {
                    piVar25 = (int *)(pBVar9 + local_70);
                    if (*piVar25 != (int)*puVar34) {
LAB_00141798:
                      puVar52 = (ulong *)((long)puVar34 + ((long)puVar34 - (long)local_150 >> 8) + 1
                                         );
                      goto LAB_00141fe0;
                    }
                  }
                  else {
                    local_70 = pUVar14[uVar54 * -0x30e4432345000000 >> (0x40U - cVar21 & 0x3f)];
                    piVar25 = (int *)(pBVar10 + local_70);
                    if ((local_70 <= uVar8) || (iVar22 = 10, *piVar25 != (int)*puVar34)) {
                      iVar22 = 0;
                    }
                    if (iVar22 != 10) {
                      puVar52 = puVar34;
                      if (iVar22 != 0) goto LAB_00141fe0;
                      goto LAB_00141798;
                    }
                    local_70 = local_70 + uVar37;
                  }
                  uVar54 = *(ulong *)((long)puVar34 + 1);
                  uVar42 = uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
                  puVar52 = (ulong *)((long)puVar34 + 1);
                  uVar53 = pUVar11[uVar42];
                  pUVar11[uVar42] = UVar31;
                  if (uVar16 < uVar53) {
                    puVar33 = (ulong *)(pBVar9 + uVar53);
                    if (*puVar33 == uVar54) {
                      puVar39 = (ulong *)((long)puVar34 + 9);
                      puVar41 = puVar33 + 1;
                      puVar40 = puVar39;
                      if (puVar39 < puVar1) {
                        uVar42 = *puVar39 ^ *puVar41;
                        uVar54 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                          }
                        }
                        pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
                        if (*puVar41 == *puVar39) {
                          puVar40 = (ulong *)((long)puVar34 + 0x11);
                          puVar41 = puVar33 + 2;
                          do {
                            if (puVar1 <= puVar40) goto LAB_00141982;
                            uVar54 = *puVar41;
                            uVar42 = *puVar40;
                            uVar46 = uVar42 ^ uVar54;
                            uVar44 = 0;
                            if (uVar46 != 0) {
                              for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                              }
                            }
                            pBVar48 = (BYTE *)((long)puVar40 +
                                              ((uVar44 >> 3 & 0x1fffffff) - (long)puVar39));
                            puVar40 = puVar40 + 1;
                            puVar41 = puVar41 + 1;
                          } while (uVar54 == uVar42);
                        }
                      }
                      else {
LAB_00141982:
                        if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
                          puVar40 = (ulong *)((long)puVar40 + 4);
                          puVar41 = (ulong *)((long)puVar41 + 4);
                        }
                        if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
                          puVar40 = (ulong *)((long)puVar40 + 2);
                          puVar41 = (ulong *)((long)puVar41 + 2);
                        }
                        if (puVar40 < iEnd) {
                          puVar40 = (ulong *)((long)puVar40 +
                                             (ulong)((BYTE)*puVar41 == (BYTE)*puVar40));
                        }
                        pBVar48 = (BYTE *)((long)puVar40 - (long)puVar39);
                      }
                      pZVar36 = (ZSTD_matchState_t *)(pBVar48 + 8);
                      uVar43 = (int)puVar52 - (int)puVar33;
                      iVar22 = 7;
                      if ((uVar16 < uVar53) && (local_150 < puVar52)) {
                        piVar26 = (int *)(pBVar5 + uVar53);
                        do {
                          puVar52 = puVar34;
                          if ((BYTE)*puVar52 != (BYTE)*piVar26) goto LAB_00141a22;
                          pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
                        } while ((iStart < piVar26) &&
                                (piVar26 = (int *)((long)piVar26 + -1),
                                puVar34 = (ulong *)((long)puVar52 + -1), local_150 < puVar52));
                      }
                      else {
LAB_00141a1d:
                        iVar22 = 7;
                      }
                    }
                    else {
LAB_00141973:
                      iVar22 = 0;
                      uVar43 = (uint)local_130;
                      puVar52 = puVar34;
                    }
                  }
                  else {
                    uVar53 = pUVar13[uVar54 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
                    puVar33 = (ulong *)(pBVar10 + uVar53);
                    if (mEnd <= puVar33) {
LAB_00142fdb:
                      __assert_fail("dictMatchL3 < dictEnd",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x3bbd,
                                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                                   );
                    }
                    if ((uVar53 <= uVar8) || (*puVar33 != uVar54)) goto LAB_00141973;
                    sVar24 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar34 + 9),(BYTE *)(puVar33 + 1),
                                        (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                    pZVar36 = (ZSTD_matchState_t *)(sVar24 + 8);
                    uVar43 = UVar31 - (uVar37 + uVar53);
                    iVar22 = 7;
                    if (uVar8 < uVar53) {
                      if (puVar52 <= local_150) goto LAB_00141a1d;
                      piVar26 = (int *)(pBVar10 + ((ulong)uVar53 - 1));
                      do {
                        puVar52 = puVar34;
                        if ((BYTE)*puVar52 != (BYTE)*piVar26) goto LAB_00141a22;
                        pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
                      } while ((piVar32 < piVar26) &&
                              (piVar26 = (int *)((long)piVar26 + -1),
                              puVar34 = (ulong *)((long)puVar52 + -1), local_150 < puVar52));
                    }
                  }
                  goto LAB_00141a34;
                }
                puVar34 = puVar52 + 1;
                puVar40 = puVar33 + 1;
                puVar39 = puVar34;
                if (puVar34 < puVar1) {
                  uVar42 = *puVar34 ^ *puVar40;
                  uVar54 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                    }
                  }
                  pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
                  if (*puVar40 == *puVar34) {
                    puVar39 = puVar52 + 2;
                    puVar40 = puVar33 + 2;
                    do {
                      if (puVar1 <= puVar39) goto LAB_00141669;
                      uVar54 = *puVar40;
                      uVar42 = *puVar39;
                      uVar46 = uVar42 ^ uVar54;
                      uVar44 = 0;
                      if (uVar46 != 0) {
                        for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                        }
                      }
                      pBVar48 = (BYTE *)((long)puVar39 +
                                        ((uVar44 >> 3 & 0x1fffffff) - (long)puVar34));
                      puVar39 = puVar39 + 1;
                      puVar40 = puVar40 + 1;
                    } while (uVar54 == uVar42);
                  }
                }
                else {
LAB_00141669:
                  if ((puVar39 < puVar2) && ((int)*puVar40 == (int)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 4);
                    puVar40 = (ulong *)((long)puVar40 + 4);
                  }
                  if ((puVar39 < puVar3) && ((short)*puVar40 == (short)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 2);
                    puVar40 = (ulong *)((long)puVar40 + 2);
                  }
                  if (puVar39 < iEnd) {
                    puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar39));
                  }
                  pBVar48 = (BYTE *)((long)puVar39 - (long)puVar34);
                }
                pZVar36 = (ZSTD_matchState_t *)(pBVar48 + 8);
                local_130 = (BYTE *)(ulong)(uint)((int)puVar52 - (int)puVar33);
                if ((uVar53 <= uVar16) || (puVar52 <= local_150)) goto LAB_00141c0a;
                piVar25 = (int *)(pBVar5 + uVar53);
                puVar34 = (ulong *)((long)puVar52 + -1);
                do {
                  if ((BYTE)*puVar34 != (BYTE)*piVar25) {
                    puVar52 = (ulong *)((long)puVar34 + 1);
                    goto LAB_00141c0a;
                  }
                  pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
                  puVar52 = (ulong *)((long)puVar34 + -1);
                } while ((iStart < piVar25) &&
                        (piVar25 = (int *)((long)piVar25 + -1), bVar15 = local_150 < puVar34,
                        puVar34 = puVar52, bVar15));
                goto LAB_00141709;
              }
              uVar53 = pUVar13[uVar54 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
              puVar34 = (ulong *)(pBVar10 + uVar53);
              if (mEnd <= puVar34) {
LAB_00142f5f:
                __assert_fail("dictMatchL < dictEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x3b8a,
                              "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                             );
              }
              iVar22 = 0;
              if ((uVar8 < uVar53) && (*puVar34 == uVar54)) {
                sVar24 = ZSTD_count_2segments
                                   ((BYTE *)(puVar52 + 1),(BYTE *)(puVar34 + 1),(BYTE *)iEnd,
                                    (BYTE *)mEnd,(BYTE *)iStart);
                pZVar36 = (ZSTD_matchState_t *)(sVar24 + 8);
                local_130 = (BYTE *)(ulong)(UVar55 - (uVar37 + uVar53));
                iVar22 = 7;
                if ((uVar8 < uVar53) && (local_150 < puVar52)) {
                  piVar25 = (int *)(pBVar10 + ((ulong)uVar53 - 1));
                  do {
                    puVar34 = (ulong *)((long)puVar52 + -1);
                    if ((*(BYTE *)puVar34 != (BYTE)*piVar25) ||
                       (pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1),
                       puVar52 = puVar34, piVar25 <= piVar32)) break;
                    piVar25 = (int *)((long)piVar25 + -1);
                  } while (local_150 < puVar34);
                }
              }
              if (iVar22 == 7) goto LAB_00141c0a;
              puVar34 = puVar52;
              if (iVar22 == 0) goto LAB_0014173f;
              goto LAB_00141fe0;
            }
            puVar34 = iEnd;
            if (uVar43 < uVar16) {
              puVar34 = mEnd;
            }
            sVar24 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar52 + 5),(BYTE *)(piVar25 + 1),(BYTE *)iEnd,
                                (BYTE *)puVar34,(BYTE *)iStart);
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                puVar52 = (ulong *)((long)puVar52 + 1);
                uVar54 = (long)puVar52 - (long)local_150;
                puVar34 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar34 + uVar54) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (iEnd < puVar52) goto LAB_00142f02;
                  if (puVar23 < puVar52) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar34,(BYTE *)local_150,(BYTE *)puVar52,(BYTE *)puVar23);
                  }
                  else {
                    uVar42 = local_150[1];
                    *puVar34 = *local_150;
                    puVar34[1] = uVar42;
                    if (0x10 < uVar54) {
                      pBVar48 = seqStore->lit;
                      puVar34 = (ulong *)(pBVar48 + 0x10);
                      puVar33 = local_150 + 2;
                      if (0xffffffffffffffe8 < (ulong)((long)puVar34 + (-8 - (long)puVar33)))
                      goto LAB_00142f9d;
                      if (0xffffffffffffffe0 < (ulong)((long)puVar34 + (-0x10 - (long)puVar33)))
                      goto LAB_00142fbc;
                      uVar42 = local_150[3];
                      *puVar34 = *puVar33;
                      *(ulong *)(pBVar48 + 0x18) = uVar42;
                      if (0x20 < (long)uVar54) {
                        lVar35 = 0;
                        do {
                          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x20);
                          uVar17 = puVar7[1];
                          pBVar4 = pBVar48 + lVar35 + 0x20;
                          *(undefined8 *)pBVar4 = *puVar7;
                          *(undefined8 *)(pBVar4 + 8) = uVar17;
                          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x30);
                          uVar17 = puVar7[1];
                          *(undefined8 *)(pBVar4 + 0x10) = *puVar7;
                          *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                          lVar35 = lVar35 + 0x20;
                        } while (pBVar4 + 0x20 < pBVar48 + uVar54);
                      }
                    }
                  }
                  seqStore->lit = seqStore->lit + uVar54;
                  if (0xffff < uVar54) {
                    if (seqStore->longLengthID != 0) goto LAB_00142f7e;
                    seqStore->longLengthID = 1;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                              >> 3);
                  }
                  pZVar36 = (ZSTD_matchState_t *)(sVar24 + 4);
                  puVar50 = (undefined1 *)(sVar24 + 1);
                  psVar28 = *ppsVar27;
                  psVar28->litLength = (U16)uVar54;
                  psVar28->offset = 1;
                  uVar53 = local_154;
                  if (puVar50 < (undefined1 *)0x10000) goto LAB_00141d80;
                  if (seqStore->longLengthID == 0) goto LAB_00141d5a;
                  goto LAB_00142f40;
                }
                goto LAB_00142ee3;
              }
              goto LAB_00142f21;
            }
            goto LAB_00142ec4;
          }
LAB_00142e93:
          *rep = local_154;
          rep[1] = local_144;
          return (long)iEnd - (long)local_150;
        }
LAB_00143038:
        __assert_fail("offset_2 <= dictAndPrefixLength",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3b53,
                      "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                     );
      }
LAB_00143019:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b52,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
LAB_00142ffa:
    __assert_fail("lowestValid + maxDistance >= endIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3b45,
                  "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (uVar53 == 6) {
    if (uVar43 <= uVar47) {
      if (local_154 <= uVar45) {
        puVar52 = (ulong *)((long)src + (ulong)(uVar45 == 0));
        if (local_144 <= uVar45) {
          if (puVar52 < puVar6) {
            bVar29 = 0x40 - cVar18;
            bVar30 = 0x40 - cVar19;
            puVar1 = (ulong *)((long)iEnd + -7);
            puVar2 = (ulong *)((long)iEnd + -3);
            puVar3 = (ulong *)((long)iEnd + -1);
            puVar23 = iEnd + -4;
            ppsVar27 = &seqStore->sequences;
            pBVar5 = pBVar9 + -1;
            local_108 = pBVar5;
LAB_001403e0:
            uVar54 = *puVar52;
            uVar42 = uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
            uVar44 = uVar54 * -0x30e4432340650000 >> (bVar30 & 0x3f);
            UVar55 = (int)puVar52 - iVar49;
            uVar53 = pUVar11[uVar42];
            UVar31 = UVar55 + 1;
            uVar43 = UVar31 - local_154;
            piVar25 = (int *)(pBVar9 + uVar43);
            if (uVar43 < uVar16) {
              piVar25 = (int *)(pBVar10 + (uVar43 - uVar37));
            }
            uVar47 = pUVar12[uVar44];
            pUVar12[uVar44] = UVar55;
            pUVar11[uVar42] = UVar55;
            if ((0xfffffffc < uVar43 - uVar16) || (*piVar25 != *(int *)((long)puVar52 + 1))) {
              if (uVar53 <= uVar16) {
                uVar53 = pUVar13[uVar54 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
                puVar34 = (ulong *)(pBVar10 + uVar53);
                if (puVar34 < mEnd) {
                  iVar22 = 0;
                  if ((uVar8 < uVar53) && (*puVar34 == uVar54)) {
                    sVar24 = ZSTD_count_2segments
                                       ((BYTE *)(puVar52 + 1),(BYTE *)(puVar34 + 1),(BYTE *)iEnd,
                                        (BYTE *)mEnd,(BYTE *)iStart);
                    src = (void *)(sVar24 + 8);
                    local_108 = (BYTE *)(ulong)(UVar55 - (uVar37 + uVar53));
                    iVar22 = 7;
                    if ((uVar8 < uVar53) && (local_150 < puVar52)) {
                      piVar25 = (int *)(pBVar10 + ((ulong)uVar53 - 1));
                      do {
                        puVar34 = (ulong *)((long)puVar52 + -1);
                        if ((*(BYTE *)puVar34 != (BYTE)*piVar25) ||
                           (src = (void *)((long)src + 1), puVar52 = puVar34, piVar25 <= piVar32))
                        break;
                        piVar25 = (int *)((long)piVar25 + -1);
                      } while (local_150 < puVar34);
                    }
                  }
                  if (iVar22 == 7) goto LAB_00140d91;
                  puVar34 = puVar52;
                  if (iVar22 == 0) goto LAB_001408ca;
                  goto LAB_0014115d;
                }
                goto LAB_00142f5f;
              }
              puVar33 = (ulong *)(pBVar9 + uVar53);
              puVar34 = puVar52;
              if (*puVar33 == uVar54) {
                puVar34 = puVar52 + 1;
                puVar40 = puVar33 + 1;
                puVar39 = puVar34;
                if (puVar34 < puVar1) {
                  uVar42 = *puVar34 ^ *puVar40;
                  uVar54 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                    }
                  }
                  pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
                  if (*puVar40 == *puVar34) {
                    puVar39 = puVar52 + 2;
                    puVar40 = puVar33 + 2;
                    do {
                      if (puVar1 <= puVar39) goto LAB_001407f1;
                      uVar54 = *puVar40;
                      uVar42 = *puVar39;
                      uVar46 = uVar42 ^ uVar54;
                      uVar44 = 0;
                      if (uVar46 != 0) {
                        for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                        }
                      }
                      pBVar48 = (BYTE *)((long)puVar39 +
                                        ((uVar44 >> 3 & 0x1fffffff) - (long)puVar34));
                      puVar39 = puVar39 + 1;
                      puVar40 = puVar40 + 1;
                    } while (uVar54 == uVar42);
                  }
                }
                else {
LAB_001407f1:
                  if ((puVar39 < puVar2) && ((int)*puVar40 == (int)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 4);
                    puVar40 = (ulong *)((long)puVar40 + 4);
                  }
                  if ((puVar39 < puVar3) && ((short)*puVar40 == (short)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 2);
                    puVar40 = (ulong *)((long)puVar40 + 2);
                  }
                  if (puVar39 < iEnd) {
                    puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar39));
                  }
                  pBVar48 = (BYTE *)((long)puVar39 - (long)puVar34);
                }
                src = pBVar48 + 8;
                local_108 = (BYTE *)(ulong)(uint)((int)puVar52 - (int)puVar33);
                if ((uVar53 <= uVar16) || (puVar52 <= local_150)) goto LAB_00140d91;
                piVar25 = (int *)(pBVar5 + uVar53);
                puVar34 = (ulong *)((long)puVar52 + -1);
                do {
                  if ((BYTE)*puVar34 != (BYTE)*piVar25) {
                    puVar52 = (ulong *)((long)puVar34 + 1);
                    goto LAB_00140d91;
                  }
                  src = (void *)((long)src + 1);
                  puVar52 = (ulong *)((long)puVar34 + -1);
                } while ((iStart < piVar25) &&
                        (piVar25 = (int *)((long)piVar25 + -1), bVar15 = local_150 < puVar34,
                        puVar34 = puVar52, bVar15));
                goto LAB_00140891;
              }
LAB_001408ca:
              puVar52 = puVar34;
              if (uVar16 < uVar47) {
                piVar25 = (int *)(pBVar9 + uVar47);
                if (*piVar25 != (int)*puVar34) {
LAB_0014091b:
                  puVar52 = (ulong *)((long)puVar34 + ((long)puVar34 - (long)local_150 >> 8) + 1);
                  goto LAB_0014115d;
                }
              }
              else {
                uVar47 = pUVar14[uVar54 * -0x30e4432340650000 >> (0x40U - cVar21 & 0x3f)];
                piVar25 = (int *)(pBVar10 + uVar47);
                if ((uVar47 <= uVar8) || (iVar22 = 10, *piVar25 != (int)*puVar34)) {
                  iVar22 = 0;
                }
                if (iVar22 != 10) {
                  if (iVar22 != 0) goto LAB_0014115d;
                  goto LAB_0014091b;
                }
                uVar47 = uVar47 + uVar37;
              }
              uVar54 = *(ulong *)((long)puVar34 + 1);
              uVar42 = uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
              puVar33 = (ulong *)((long)puVar34 + 1);
              uVar53 = pUVar11[uVar42];
              pUVar11[uVar42] = UVar31;
              uVar43 = (uint)local_108;
              if (uVar16 < uVar53) {
                puVar39 = (ulong *)(pBVar9 + uVar53);
                iVar22 = 0;
                if (*puVar39 == uVar54) {
                  puVar52 = (ulong *)((long)puVar34 + 9);
                  puVar41 = puVar39 + 1;
                  puVar40 = puVar52;
                  if (puVar52 < puVar1) {
                    uVar42 = *puVar52 ^ *puVar41;
                    uVar54 = 0;
                    if (uVar42 != 0) {
                      for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                      }
                    }
                    pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
                    if (*puVar41 == *puVar52) {
                      puVar40 = (ulong *)((long)puVar34 + 0x11);
                      puVar41 = puVar39 + 2;
                      do {
                        if (puVar1 <= puVar40) goto LAB_00140b1b;
                        uVar54 = *puVar41;
                        uVar42 = *puVar40;
                        uVar46 = uVar42 ^ uVar54;
                        uVar44 = 0;
                        if (uVar46 != 0) {
                          for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                          }
                        }
                        pBVar48 = (BYTE *)((long)puVar40 +
                                          ((uVar44 >> 3 & 0x1fffffff) - (long)puVar52));
                        puVar40 = puVar40 + 1;
                        puVar41 = puVar41 + 1;
                      } while (uVar54 == uVar42);
                    }
                  }
                  else {
LAB_00140b1b:
                    if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar40 < iEnd) {
                      puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40))
                      ;
                    }
                    pBVar48 = (BYTE *)((long)puVar40 - (long)puVar52);
                  }
                  src = pBVar48 + 8;
                  uVar43 = (int)puVar33 - (int)puVar39;
                  iVar22 = 7;
                  puVar52 = puVar33;
                  if ((uVar16 < uVar53) && (local_150 < puVar33)) {
                    piVar26 = (int *)(pBVar5 + uVar53);
                    while (puVar52 = puVar34, (BYTE)*puVar52 == (BYTE)*piVar26) {
                      src = (void *)((long)src + 1);
                      if ((piVar26 <= iStart) ||
                         (piVar26 = (int *)((long)piVar26 + -1),
                         puVar34 = (ulong *)((long)puVar52 + -1), puVar52 <= local_150))
                      goto LAB_00140bc6;
                    }
                    puVar52 = (ulong *)((long)puVar52 + 1);
                  }
                }
              }
              else {
                uVar53 = pUVar13[uVar54 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
                puVar39 = (ulong *)(pBVar10 + uVar53);
                if (mEnd <= puVar39) goto LAB_00142fdb;
                iVar22 = 0;
                if ((uVar8 < uVar53) && (*puVar39 == uVar54)) {
                  sVar24 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar34 + 9),(BYTE *)(puVar39 + 1),(BYTE *)iEnd
                                      ,(BYTE *)mEnd,(BYTE *)iStart);
                  src = (void *)(sVar24 + 8);
                  uVar43 = UVar31 - (uVar37 + uVar53);
                  iVar22 = 7;
                  puVar52 = puVar33;
                  if ((uVar8 < uVar53) && (local_150 < puVar33)) {
                    piVar26 = (int *)(pBVar10 + ((ulong)uVar53 - 1));
                    while (puVar52 = puVar34, (BYTE)*puVar52 == (BYTE)*piVar26) {
                      src = (void *)((long)src + 1);
                      if ((piVar26 <= piVar32) ||
                         (piVar26 = (int *)((long)piVar26 + -1),
                         puVar34 = (ulong *)((long)puVar52 + -1), puVar52 <= local_150))
                      goto LAB_00140bc6;
                    }
                    puVar52 = (ulong *)((long)puVar52 + 1);
                  }
                }
              }
LAB_00140bc6:
              if (iVar22 == 7) {
                local_108 = (BYTE *)(ulong)uVar43;
                goto LAB_00140d91;
              }
              if (iVar22 != 0) {
                local_108 = (BYTE *)(ulong)uVar43;
                goto LAB_0014115d;
              }
              puVar34 = (ulong *)((long)puVar52 + 4);
              puVar33 = (ulong *)(piVar25 + 1);
              if (uVar47 < uVar16) {
                sVar24 = ZSTD_count_2segments
                                   ((BYTE *)puVar34,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,
                                    (BYTE *)iStart);
                src = (void *)(sVar24 + 4);
                local_108 = (BYTE *)(ulong)(UVar55 - uVar47);
                if ((piVar32 < piVar25) && (local_150 < puVar52)) {
                  puVar34 = (ulong *)((long)puVar52 + -1);
                  do {
                    piVar25 = (int *)((long)piVar25 + -1);
                    if ((BYTE)*puVar34 != *(BYTE *)piVar25) goto LAB_00140d8b;
                    src = (void *)((long)src + 1);
                    puVar52 = (ulong *)((long)puVar34 + -1);
                  } while ((piVar32 < piVar25) &&
                          (bVar15 = local_150 < puVar34, puVar34 = puVar52, bVar15));
LAB_00140891:
                  puVar52 = (ulong *)((long)puVar52 + 1);
                }
              }
              else {
                puVar39 = puVar34;
                if (puVar34 < puVar1) {
                  uVar42 = *puVar34 ^ *puVar33;
                  uVar54 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                    }
                  }
                  pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
                  if (*puVar33 == *puVar34) {
                    puVar39 = (ulong *)((long)puVar52 + 0xc);
                    puVar33 = (ulong *)(piVar25 + 3);
                    do {
                      if (puVar1 <= puVar39) goto LAB_00140cf2;
                      uVar54 = *puVar33;
                      uVar42 = *puVar39;
                      uVar46 = uVar42 ^ uVar54;
                      uVar44 = 0;
                      if (uVar46 != 0) {
                        for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                        }
                      }
                      pBVar48 = (BYTE *)((long)puVar39 +
                                        ((uVar44 >> 3 & 0x1fffffff) - (long)puVar34));
                      puVar39 = puVar39 + 1;
                      puVar33 = puVar33 + 1;
                    } while (uVar54 == uVar42);
                  }
                }
                else {
LAB_00140cf2:
                  if ((puVar39 < puVar2) && ((int)*puVar33 == (int)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar39 < puVar3) && ((short)*puVar33 == (short)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar39 < iEnd) {
                    puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar39));
                  }
                  pBVar48 = (BYTE *)((long)puVar39 - (long)puVar34);
                }
                src = pBVar48 + 4;
                local_108 = (BYTE *)(ulong)(uint)((int)puVar52 - (int)piVar25);
                if ((iStart < piVar25) && (local_150 < puVar52)) {
                  puVar34 = (ulong *)((long)puVar52 + -1);
                  do {
                    piVar25 = (int *)((long)piVar25 + -1);
                    if ((BYTE)*puVar34 != *(BYTE *)piVar25) goto LAB_00140d8b;
                    src = (void *)((long)src + 1);
                    puVar52 = (ulong *)((long)puVar34 + -1);
                  } while ((iStart < piVar25) &&
                          (bVar15 = local_150 < puVar34, puVar34 = puVar52, bVar15));
                  goto LAB_00140891;
                }
              }
              goto LAB_00140d91;
            }
            puVar34 = iEnd;
            if (uVar43 < uVar16) {
              puVar34 = mEnd;
            }
            sVar24 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar52 + 5),(BYTE *)(piVar25 + 1),(BYTE *)iEnd,
                                (BYTE *)puVar34,(BYTE *)iStart);
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                puVar52 = (ulong *)((long)puVar52 + 1);
                uVar54 = (long)puVar52 - (long)local_150;
                puVar34 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar34 + uVar54) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (iEnd < puVar52) goto LAB_00142f02;
                  if (puVar23 < puVar52) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar34,(BYTE *)local_150,(BYTE *)puVar52,(BYTE *)puVar23);
                  }
                  else {
                    uVar42 = local_150[1];
                    *puVar34 = *local_150;
                    puVar34[1] = uVar42;
                    if (0x10 < uVar54) {
                      pBVar48 = seqStore->lit;
                      puVar34 = (ulong *)(pBVar48 + 0x10);
                      puVar33 = local_150 + 2;
                      if (0xffffffffffffffe8 < (ulong)((long)puVar34 + (-8 - (long)puVar33)))
                      goto LAB_00142f9d;
                      if (0xffffffffffffffe0 < (ulong)((long)puVar34 + (-0x10 - (long)puVar33)))
                      goto LAB_00142fbc;
                      uVar42 = local_150[3];
                      *puVar34 = *puVar33;
                      *(ulong *)(pBVar48 + 0x18) = uVar42;
                      if (0x20 < (long)uVar54) {
                        lVar35 = 0;
                        do {
                          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x20);
                          uVar17 = puVar7[1];
                          pBVar4 = pBVar48 + lVar35 + 0x20;
                          *(undefined8 *)pBVar4 = *puVar7;
                          *(undefined8 *)(pBVar4 + 8) = uVar17;
                          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x30);
                          uVar17 = puVar7[1];
                          *(undefined8 *)(pBVar4 + 0x10) = *puVar7;
                          *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                          lVar35 = lVar35 + 0x20;
                        } while (pBVar4 + 0x20 < pBVar48 + uVar54);
                      }
                    }
                  }
                  seqStore->lit = seqStore->lit + uVar54;
                  if (0xffff < uVar54) {
                    if (seqStore->longLengthID != 0) goto LAB_00142f7e;
                    seqStore->longLengthID = 1;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                              >> 3);
                  }
                  src = (void *)(sVar24 + 4);
                  pBVar48 = (BYTE *)(sVar24 + 1);
                  psVar28 = *ppsVar27;
                  psVar28->litLength = (U16)uVar54;
                  psVar28->offset = 1;
                  uVar53 = local_154;
                  if (pBVar48 < (BYTE *)0x10000) goto LAB_00140f03;
                  if (seqStore->longLengthID == 0) goto LAB_00140edd;
                  goto LAB_00142f40;
                }
                goto LAB_00142ee3;
              }
              goto LAB_00142f21;
            }
            goto LAB_00142ec4;
          }
          goto LAB_00142e93;
        }
        goto LAB_00143038;
      }
      goto LAB_00143019;
    }
    goto LAB_00142ffa;
  }
  if (uVar53 != 7) {
    if (uVar43 <= uVar47) {
      if (local_154 <= uVar45) {
        puVar52 = (ulong *)((long)src + (ulong)(uVar45 == 0));
        if (local_144 <= uVar45) {
          if (puVar52 < puVar6) {
            bVar29 = 0x40 - cVar18;
            bVar30 = 0x20 - cVar19;
            puVar1 = (ulong *)((long)iEnd + -7);
            puVar2 = (ulong *)((long)iEnd + -3);
            puVar3 = (ulong *)((long)iEnd + -1);
            puVar23 = iEnd + -4;
            ppsVar27 = &seqStore->sequences;
            pBVar5 = pBVar9 + -1;
            local_130 = pBVar5;
LAB_001420dd:
            uVar54 = *puVar52;
            uVar42 = uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
            uVar43 = (int)*puVar52 * -0x61c8864f;
            uVar45 = uVar43 >> (bVar30 & 0x1f);
            UVar55 = (int)puVar52 - iVar49;
            uVar53 = pUVar11[uVar42];
            UVar31 = UVar55 + 1;
            uVar47 = UVar31 - local_154;
            piVar25 = (int *)(pBVar9 + uVar47);
            if (uVar47 < uVar16) {
              piVar25 = (int *)(pBVar10 + (uVar47 - uVar37));
            }
            uVar51 = pUVar12[uVar45];
            pUVar12[uVar45] = UVar55;
            pUVar11[uVar42] = UVar55;
            if ((0xfffffffc < uVar47 - uVar16) || (*piVar25 != *(int *)((long)puVar52 + 1))) {
              if (uVar53 <= uVar16) {
                uVar53 = pUVar13[uVar54 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
                puVar34 = (ulong *)(pBVar10 + uVar53);
                if (puVar34 < mEnd) {
                  iVar22 = 0;
                  if ((uVar8 < uVar53) && (*puVar34 == *puVar52)) {
                    sVar24 = ZSTD_count_2segments
                                       ((BYTE *)(puVar52 + 1),(BYTE *)(puVar34 + 1),(BYTE *)iEnd,
                                        (BYTE *)mEnd,(BYTE *)iStart);
                    pZVar36 = (ZSTD_matchState_t *)(sVar24 + 8);
                    local_130 = (BYTE *)(ulong)(UVar55 - (uVar37 + uVar53));
                    iVar22 = 7;
                    if ((uVar8 < uVar53) && (local_150 < puVar52)) {
                      piVar25 = (int *)(pBVar10 + ((ulong)uVar53 - 1));
                      do {
                        puVar34 = (ulong *)((long)puVar52 + -1);
                        if ((*(BYTE *)puVar34 != (BYTE)*piVar25) ||
                           (pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1),
                           puVar52 = puVar34, piVar25 <= piVar32)) break;
                        piVar25 = (int *)((long)piVar25 + -1);
                      } while (local_150 < puVar34);
                    }
                  }
                  if (iVar22 == 7) goto LAB_00142a70;
                  puVar34 = puVar52;
                  if (iVar22 == 0) goto LAB_001425c2;
                  goto LAB_00142e6e;
                }
                goto LAB_00142f5f;
              }
              puVar33 = (ulong *)(pBVar9 + uVar53);
              puVar34 = puVar52;
              if (*puVar33 == *puVar52) {
                puVar34 = puVar52 + 1;
                puVar40 = puVar33 + 1;
                puVar39 = puVar34;
                if (puVar34 < puVar1) {
                  uVar42 = *puVar34 ^ *puVar40;
                  uVar54 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                    }
                  }
                  pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
                  if (*puVar40 == *puVar34) {
                    puVar39 = puVar52 + 2;
                    puVar40 = puVar33 + 2;
                    do {
                      if (puVar1 <= puVar39) goto LAB_001424ec;
                      uVar54 = *puVar40;
                      uVar42 = *puVar39;
                      uVar46 = uVar42 ^ uVar54;
                      uVar44 = 0;
                      if (uVar46 != 0) {
                        for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                        }
                      }
                      pBVar48 = (BYTE *)((long)puVar39 +
                                        ((uVar44 >> 3 & 0x1fffffff) - (long)puVar34));
                      puVar39 = puVar39 + 1;
                      puVar40 = puVar40 + 1;
                    } while (uVar54 == uVar42);
                  }
                }
                else {
LAB_001424ec:
                  if ((puVar39 < puVar2) && ((int)*puVar40 == (int)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 4);
                    puVar40 = (ulong *)((long)puVar40 + 4);
                  }
                  if ((puVar39 < puVar3) && ((short)*puVar40 == (short)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 2);
                    puVar40 = (ulong *)((long)puVar40 + 2);
                  }
                  if (puVar39 < iEnd) {
                    puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar39));
                  }
                  pBVar48 = (BYTE *)((long)puVar39 - (long)puVar34);
                }
                pZVar36 = (ZSTD_matchState_t *)(pBVar48 + 8);
                local_130 = (BYTE *)(ulong)(uint)((int)puVar52 - (int)puVar33);
                if ((uVar53 <= uVar16) || (puVar52 <= local_150)) goto LAB_00142a70;
                piVar25 = (int *)(pBVar5 + uVar53);
                puVar34 = (ulong *)((long)puVar52 + -1);
                do {
                  if ((BYTE)*puVar34 != (BYTE)*piVar25) {
                    puVar52 = (ulong *)((long)puVar34 + 1);
                    goto LAB_00142a70;
                  }
                  pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
                  puVar52 = (ulong *)((long)puVar34 + -1);
                } while ((iStart < piVar25) &&
                        (piVar25 = (int *)((long)piVar25 + -1), bVar15 = local_150 < puVar34,
                        puVar34 = puVar52, bVar15));
                goto LAB_0014258c;
              }
LAB_001425c2:
              puVar52 = puVar34;
              if (uVar16 < uVar51) {
                piVar25 = (int *)(pBVar9 + uVar51);
                if (*piVar25 != (int)*puVar34) {
LAB_00142618:
                  puVar52 = (ulong *)((long)puVar34 + ((long)puVar34 - (long)local_150 >> 8) + 1);
                  goto LAB_00142e6e;
                }
              }
              else {
                uVar51 = pUVar14[uVar43 >> (0x20U - cVar21 & 0x1f)];
                piVar25 = (int *)(pBVar10 + uVar51);
                if ((uVar51 <= uVar8) || (iVar22 = 10, *piVar25 != (int)*puVar34)) {
                  iVar22 = 0;
                }
                if (iVar22 != 10) {
                  if (iVar22 != 0) goto LAB_00142e6e;
                  goto LAB_00142618;
                }
                uVar51 = uVar51 + uVar37;
              }
              uVar54 = *(ulong *)((long)puVar34 + 1);
              uVar42 = uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
              puVar33 = (ulong *)((long)puVar34 + 1);
              uVar53 = pUVar11[uVar42];
              pUVar11[uVar42] = UVar31;
              uVar43 = (uint)local_130;
              if (uVar16 < uVar53) {
                puVar39 = (ulong *)(pBVar9 + uVar53);
                iVar22 = 0;
                if (*puVar39 == uVar54) {
                  puVar52 = (ulong *)((long)puVar34 + 9);
                  puVar41 = puVar39 + 1;
                  puVar40 = puVar52;
                  if (puVar52 < puVar1) {
                    uVar42 = *puVar52 ^ *puVar41;
                    uVar54 = 0;
                    if (uVar42 != 0) {
                      for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                      }
                    }
                    pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
                    if (*puVar41 == *puVar52) {
                      puVar40 = (ulong *)((long)puVar34 + 0x11);
                      puVar41 = puVar39 + 2;
                      do {
                        if (puVar1 <= puVar40) goto LAB_00142800;
                        uVar54 = *puVar41;
                        uVar42 = *puVar40;
                        uVar46 = uVar42 ^ uVar54;
                        uVar44 = 0;
                        if (uVar46 != 0) {
                          for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                          }
                        }
                        pBVar48 = (BYTE *)((long)puVar40 +
                                          ((uVar44 >> 3 & 0x1fffffff) - (long)puVar52));
                        puVar40 = puVar40 + 1;
                        puVar41 = puVar41 + 1;
                      } while (uVar54 == uVar42);
                    }
                  }
                  else {
LAB_00142800:
                    if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar40 < iEnd) {
                      puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40))
                      ;
                    }
                    pBVar48 = (BYTE *)((long)puVar40 - (long)puVar52);
                  }
                  pZVar36 = (ZSTD_matchState_t *)(pBVar48 + 8);
                  uVar43 = (int)puVar33 - (int)puVar39;
                  iVar22 = 7;
                  puVar52 = puVar33;
                  if ((uVar16 < uVar53) && (local_150 < puVar33)) {
                    piVar26 = (int *)(pBVar5 + uVar53);
                    while (puVar52 = puVar34, (BYTE)*puVar52 == (BYTE)*piVar26) {
                      pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
                      if ((piVar26 <= iStart) ||
                         (piVar26 = (int *)((long)piVar26 + -1),
                         puVar34 = (ulong *)((long)puVar52 + -1), puVar52 <= local_150))
                      goto LAB_001428ac;
                    }
                    puVar52 = (ulong *)((long)puVar52 + 1);
                  }
                }
              }
              else {
                uVar53 = pUVar13[uVar54 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
                puVar39 = (ulong *)(pBVar10 + uVar53);
                if (mEnd <= puVar39) goto LAB_00142fdb;
                iVar22 = 0;
                if ((uVar8 < uVar53) && (*puVar39 == uVar54)) {
                  sVar24 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar34 + 9),(BYTE *)(puVar39 + 1),(BYTE *)iEnd
                                      ,(BYTE *)mEnd,(BYTE *)iStart);
                  pZVar36 = (ZSTD_matchState_t *)(sVar24 + 8);
                  uVar43 = UVar31 - (uVar37 + uVar53);
                  iVar22 = 7;
                  puVar52 = puVar33;
                  if ((uVar8 < uVar53) && (local_150 < puVar33)) {
                    piVar26 = (int *)(pBVar10 + ((ulong)uVar53 - 1));
                    while (puVar52 = puVar34, (BYTE)*puVar52 == (BYTE)*piVar26) {
                      pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
                      if ((piVar26 <= piVar32) ||
                         (piVar26 = (int *)((long)piVar26 + -1),
                         puVar34 = (ulong *)((long)puVar52 + -1), puVar52 <= local_150))
                      goto LAB_001428ac;
                    }
                    puVar52 = (ulong *)((long)puVar52 + 1);
                  }
                }
              }
LAB_001428ac:
              if (iVar22 == 7) {
                local_130 = (BYTE *)(ulong)uVar43;
                goto LAB_00142a70;
              }
              if (iVar22 != 0) {
                local_130 = (BYTE *)(ulong)uVar43;
                goto LAB_00142e6e;
              }
              puVar34 = (ulong *)((long)puVar52 + 4);
              puVar33 = (ulong *)(piVar25 + 1);
              if (uVar51 < uVar16) {
                sVar24 = ZSTD_count_2segments
                                   ((BYTE *)puVar34,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,
                                    (BYTE *)iStart);
                pZVar36 = (ZSTD_matchState_t *)(sVar24 + 4);
                local_130 = (BYTE *)(ulong)(UVar55 - uVar51);
                if ((piVar32 < piVar25) && (local_150 < puVar52)) {
                  puVar34 = (ulong *)((long)puVar52 + -1);
                  do {
                    piVar25 = (int *)((long)piVar25 + -1);
                    if ((BYTE)*puVar34 != *(BYTE *)piVar25) goto LAB_00142a6a;
                    pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
                    puVar52 = (ulong *)((long)puVar34 + -1);
                  } while ((piVar32 < piVar25) &&
                          (bVar15 = local_150 < puVar34, puVar34 = puVar52, bVar15));
LAB_0014258c:
                  puVar52 = (ulong *)((long)puVar52 + 1);
                }
              }
              else {
                puVar39 = puVar34;
                if (puVar34 < puVar1) {
                  uVar42 = *puVar34 ^ *puVar33;
                  uVar54 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                    }
                  }
                  pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
                  if (*puVar33 == *puVar34) {
                    puVar39 = (ulong *)((long)puVar52 + 0xc);
                    puVar33 = (ulong *)(piVar25 + 3);
                    do {
                      if (puVar1 <= puVar39) goto LAB_001429d1;
                      uVar54 = *puVar33;
                      uVar42 = *puVar39;
                      uVar46 = uVar42 ^ uVar54;
                      uVar44 = 0;
                      if (uVar46 != 0) {
                        for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                        }
                      }
                      pBVar48 = (BYTE *)((long)puVar39 +
                                        ((uVar44 >> 3 & 0x1fffffff) - (long)puVar34));
                      puVar39 = puVar39 + 1;
                      puVar33 = puVar33 + 1;
                    } while (uVar54 == uVar42);
                  }
                }
                else {
LAB_001429d1:
                  if ((puVar39 < puVar2) && ((int)*puVar33 == (int)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar39 < puVar3) && ((short)*puVar33 == (short)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar39 < iEnd) {
                    puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar39));
                  }
                  pBVar48 = (BYTE *)((long)puVar39 - (long)puVar34);
                }
                pZVar36 = (ZSTD_matchState_t *)(pBVar48 + 4);
                local_130 = (BYTE *)(ulong)(uint)((int)puVar52 - (int)piVar25);
                if ((iStart < piVar25) && (local_150 < puVar52)) {
                  puVar34 = (ulong *)((long)puVar52 + -1);
                  do {
                    piVar25 = (int *)((long)piVar25 + -1);
                    if ((BYTE)*puVar34 != *(BYTE *)piVar25) goto LAB_00142a6a;
                    pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
                    puVar52 = (ulong *)((long)puVar34 + -1);
                  } while ((iStart < piVar25) &&
                          (bVar15 = local_150 < puVar34, puVar34 = puVar52, bVar15));
                  goto LAB_0014258c;
                }
              }
              goto LAB_00142a70;
            }
            puVar34 = iEnd;
            if (uVar47 < uVar16) {
              puVar34 = mEnd;
            }
            sVar24 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar52 + 5),(BYTE *)(piVar25 + 1),(BYTE *)iEnd,
                                (BYTE *)puVar34,(BYTE *)iStart);
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                puVar52 = (ulong *)((long)puVar52 + 1);
                uVar54 = (long)puVar52 - (long)local_150;
                puVar34 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar34 + uVar54) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (iEnd < puVar52) goto LAB_00142f02;
                  if (puVar23 < puVar52) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar34,(BYTE *)local_150,(BYTE *)puVar52,(BYTE *)puVar23);
                  }
                  else {
                    uVar42 = local_150[1];
                    *puVar34 = *local_150;
                    puVar34[1] = uVar42;
                    if (0x10 < uVar54) {
                      pBVar48 = seqStore->lit;
                      puVar34 = (ulong *)(pBVar48 + 0x10);
                      puVar33 = local_150 + 2;
                      if (0xffffffffffffffe8 < (ulong)((long)puVar34 + (-8 - (long)puVar33)))
                      goto LAB_00142f9d;
                      if (0xffffffffffffffe0 < (ulong)((long)puVar34 + (-0x10 - (long)puVar33)))
                      goto LAB_00142fbc;
                      uVar42 = local_150[3];
                      *puVar34 = *puVar33;
                      *(ulong *)(pBVar48 + 0x18) = uVar42;
                      if (0x20 < (long)uVar54) {
                        lVar35 = 0;
                        do {
                          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x20);
                          uVar17 = puVar7[1];
                          pBVar4 = pBVar48 + lVar35 + 0x20;
                          *(undefined8 *)pBVar4 = *puVar7;
                          *(undefined8 *)(pBVar4 + 8) = uVar17;
                          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x30);
                          uVar17 = puVar7[1];
                          *(undefined8 *)(pBVar4 + 0x10) = *puVar7;
                          *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                          lVar35 = lVar35 + 0x20;
                        } while (pBVar4 + 0x20 < pBVar48 + uVar54);
                      }
                    }
                  }
                  seqStore->lit = seqStore->lit + uVar54;
                  if (0xffff < uVar54) {
                    if (seqStore->longLengthID != 0) goto LAB_00142f7e;
                    seqStore->longLengthID = 1;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                              >> 3);
                  }
                  pZVar36 = (ZSTD_matchState_t *)(sVar24 + 4);
                  puVar50 = (undefined1 *)(sVar24 + 1);
                  psVar28 = *ppsVar27;
                  psVar28->litLength = (U16)uVar54;
                  psVar28->offset = 1;
                  if (puVar50 < (undefined1 *)0x10000) goto LAB_00142c10;
                  if (seqStore->longLengthID == 0) goto LAB_00142be9;
                  goto LAB_00142f40;
                }
                goto LAB_00142ee3;
              }
              goto LAB_00142f21;
            }
            goto LAB_00142ec4;
          }
          goto LAB_00142e93;
        }
        goto LAB_00143038;
      }
      goto LAB_00143019;
    }
    goto LAB_00142ffa;
  }
  if (uVar47 < uVar43) goto LAB_00142ffa;
  if (uVar45 < local_154) goto LAB_00143019;
  puVar52 = (ulong *)((long)src + (ulong)(uVar45 == 0));
  if (uVar45 < local_144) goto LAB_00143038;
  if (puVar6 <= puVar52) goto LAB_00142e93;
  bVar29 = 0x40 - cVar18;
  bVar30 = 0x40 - cVar19;
  puVar1 = (ulong *)((long)iEnd - 7);
  puVar2 = (ulong *)((long)iEnd - 3);
  puVar3 = (ulong *)((long)iEnd - 1);
  puVar23 = iEnd + -4;
  ppsVar27 = &seqStore->sequences;
  pBVar5 = pBVar9 + -1;
  local_130 = pBVar5;
LAB_0013f57d:
  uVar54 = *puVar52;
  uVar42 = uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
  uVar44 = uVar54 * -0x30e44323405a9d00 >> (bVar30 & 0x3f);
  UVar55 = (int)puVar52 - iVar49;
  uVar53 = pUVar11[uVar42];
  UVar31 = UVar55 + 1;
  uVar43 = UVar31 - local_154;
  piVar25 = (int *)(pBVar9 + uVar43);
  if (uVar43 < uVar16) {
    piVar25 = (int *)(pBVar10 + (uVar43 - uVar37));
  }
  local_70 = pUVar12[uVar44];
  pUVar12[uVar44] = UVar55;
  pUVar11[uVar42] = UVar55;
  if ((uVar43 - uVar16 < 0xfffffffd) && (*piVar25 == *(int *)((long)puVar52 + 1))) {
    puVar34 = iEnd;
    if (uVar43 < uVar16) {
      puVar34 = mEnd;
    }
    sVar24 = ZSTD_count_2segments
                       ((BYTE *)((long)puVar52 + 5),(BYTE *)(piVar25 + 1),(BYTE *)iEnd,
                        (BYTE *)puVar34,(BYTE *)iStart);
    if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
        seqStore->maxNbSeq) {
      if (seqStore->maxNbLit < 0x20001) {
        puVar52 = (ulong *)((long)puVar52 + 1);
        uVar54 = (long)puVar52 - (long)local_150;
        puVar34 = (ulong *)seqStore->lit;
        if ((BYTE *)((long)puVar34 + uVar54) <= seqStore->litStart + seqStore->maxNbLit) {
          if (iEnd < puVar52) goto LAB_00142f02;
          if (puVar23 < puVar52) {
            ZSTD_safecopyLiterals((BYTE *)puVar34,(BYTE *)local_150,(BYTE *)puVar52,(BYTE *)puVar23)
            ;
          }
          else {
            uVar42 = local_150[1];
            *puVar34 = *local_150;
            puVar34[1] = uVar42;
            if (0x10 < uVar54) {
              pBVar48 = seqStore->lit;
              puVar34 = (ulong *)(pBVar48 + 0x10);
              puVar33 = local_150 + 2;
              if (0xffffffffffffffe8 < (ulong)((long)puVar34 + (-8 - (long)puVar33)))
              goto LAB_00142f9d;
              if (0xffffffffffffffe0 < (ulong)((long)puVar34 + (-0x10 - (long)puVar33)))
              goto LAB_00142fbc;
              uVar42 = local_150[3];
              *puVar34 = *puVar33;
              *(ulong *)(pBVar48 + 0x18) = uVar42;
              if (0x20 < (long)uVar54) {
                lVar35 = 0;
                do {
                  puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x20);
                  uVar17 = puVar7[1];
                  pBVar4 = pBVar48 + lVar35 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar7;
                  *(undefined8 *)(pBVar4 + 8) = uVar17;
                  puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x30);
                  uVar17 = puVar7[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar7;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                  lVar35 = lVar35 + 0x20;
                } while (pBVar4 + 0x20 < pBVar48 + uVar54);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar54;
          if (0xffff < uVar54) {
            if (seqStore->longLengthID != 0) goto LAB_00142f7e;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          pZVar36 = (ZSTD_matchState_t *)(sVar24 + 4);
          puVar50 = (undefined1 *)(sVar24 + 1);
          psVar28 = *ppsVar27;
          psVar28->litLength = (U16)uVar54;
          psVar28->offset = 1;
          uVar53 = local_154;
          if (puVar50 < (undefined1 *)0x10000) goto LAB_00140090;
          if (seqStore->longLengthID == 0) goto LAB_0014006a;
          goto LAB_00142f40;
        }
        goto LAB_00142ee3;
      }
      goto LAB_00142f21;
    }
    goto LAB_00142ec4;
  }
  if (uVar53 <= uVar16) {
    uVar53 = pUVar13[uVar54 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
    puVar34 = (ulong *)(pBVar10 + uVar53);
    if (puVar34 < mEnd) {
      iVar22 = 0;
      if ((uVar8 < uVar53) && (*puVar34 == uVar54)) {
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)(puVar52 + 1),(BYTE *)(puVar34 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                            (BYTE *)iStart);
        pZVar36 = (ZSTD_matchState_t *)(sVar24 + 8);
        local_130 = (BYTE *)(ulong)(UVar55 - (uVar37 + uVar53));
        iVar22 = 7;
        if ((uVar8 < uVar53) && (local_150 < puVar52)) {
          piVar25 = (int *)(pBVar10 + ((ulong)uVar53 - 1));
          do {
            puVar34 = (ulong *)((long)puVar52 + -1);
            if ((*(BYTE *)puVar34 != (BYTE)*piVar25) ||
               (pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1),
               puVar52 = puVar34, piVar25 <= piVar32)) break;
            piVar25 = (int *)((long)piVar25 + -1);
          } while (local_150 < puVar34);
        }
      }
      if (iVar22 == 7) goto LAB_0013ff1a;
      puVar34 = puVar52;
      if (iVar22 == 0) goto LAB_0013fa4f;
      goto LAB_001402f0;
    }
    goto LAB_00142f5f;
  }
  puVar33 = (ulong *)(pBVar9 + uVar53);
  puVar34 = puVar52;
  if (*puVar33 == uVar54) {
    puVar34 = puVar52 + 1;
    puVar40 = puVar33 + 1;
    puVar39 = puVar34;
    if (puVar34 < puVar1) {
      uVar42 = *puVar34 ^ *puVar40;
      uVar54 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
        }
      }
      pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
      if (*puVar40 == *puVar34) {
        puVar39 = puVar52 + 2;
        puVar40 = puVar33 + 2;
        do {
          if (puVar1 <= puVar39) goto LAB_0013f979;
          uVar54 = *puVar40;
          uVar42 = *puVar39;
          uVar46 = uVar42 ^ uVar54;
          uVar44 = 0;
          if (uVar46 != 0) {
            for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          pBVar48 = (BYTE *)((long)puVar39 + ((uVar44 >> 3 & 0x1fffffff) - (long)puVar34));
          puVar39 = puVar39 + 1;
          puVar40 = puVar40 + 1;
        } while (uVar54 == uVar42);
      }
    }
    else {
LAB_0013f979:
      if ((puVar39 < puVar2) && ((int)*puVar40 == (int)*puVar39)) {
        puVar39 = (ulong *)((long)puVar39 + 4);
        puVar40 = (ulong *)((long)puVar40 + 4);
      }
      if ((puVar39 < puVar3) && ((short)*puVar40 == (short)*puVar39)) {
        puVar39 = (ulong *)((long)puVar39 + 2);
        puVar40 = (ulong *)((long)puVar40 + 2);
      }
      if (puVar39 < iEnd) {
        puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar40 == (BYTE)*puVar39));
      }
      pBVar48 = (BYTE *)((long)puVar39 - (long)puVar34);
    }
    pZVar36 = (ZSTD_matchState_t *)(pBVar48 + 8);
    local_130 = (BYTE *)(ulong)(uint)((int)puVar52 - (int)puVar33);
    if ((uVar53 <= uVar16) || (puVar52 <= local_150)) goto LAB_0013ff1a;
    piVar25 = (int *)(pBVar5 + uVar53);
    puVar34 = (ulong *)((long)puVar52 + -1);
    do {
      if ((BYTE)*puVar34 != (BYTE)*piVar25) {
        puVar52 = (ulong *)((long)puVar34 + 1);
        goto LAB_0013ff1a;
      }
      pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
      puVar52 = (ulong *)((long)puVar34 + -1);
    } while ((iStart < piVar25) &&
            (piVar25 = (int *)((long)piVar25 + -1), bVar15 = local_150 < puVar34, puVar34 = puVar52,
            bVar15));
    goto LAB_0013fa19;
  }
LAB_0013fa4f:
  if (uVar16 < local_70) {
    piVar25 = (int *)(pBVar9 + local_70);
    if (*piVar25 != (int)*puVar34) {
LAB_0013faa8:
      puVar52 = (ulong *)((long)puVar34 + ((long)puVar34 - (long)local_150 >> 8) + 1);
      goto LAB_001402f0;
    }
  }
  else {
    local_70 = pUVar14[uVar54 * -0x30e44323405a9d00 >> (0x40U - cVar21 & 0x3f)];
    piVar25 = (int *)(pBVar10 + local_70);
    if ((local_70 <= uVar8) || (iVar22 = 10, *piVar25 != (int)*puVar34)) {
      iVar22 = 0;
    }
    if (iVar22 != 10) {
      puVar52 = puVar34;
      if (iVar22 != 0) goto LAB_001402f0;
      goto LAB_0013faa8;
    }
    local_70 = local_70 + uVar37;
  }
  uVar54 = *(ulong *)((long)puVar34 + 1);
  uVar42 = uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
  puVar52 = (ulong *)((long)puVar34 + 1);
  uVar53 = pUVar11[uVar42];
  pUVar11[uVar42] = UVar31;
  if (uVar53 <= uVar16) {
    uVar53 = pUVar13[uVar54 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
    puVar33 = (ulong *)(pBVar10 + uVar53);
    if (puVar33 < mEnd) {
      if ((uVar8 < uVar53) && (*puVar33 == uVar54)) {
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar34 + 9),(BYTE *)(puVar33 + 1),(BYTE *)iEnd,
                            (BYTE *)mEnd,(BYTE *)iStart);
        pZVar36 = (ZSTD_matchState_t *)(sVar24 + 8);
        uVar43 = UVar31 - (uVar37 + uVar53);
        iVar22 = 7;
        if (uVar8 < uVar53) {
          if (puVar52 <= local_150) goto LAB_0013fd2d;
          piVar26 = (int *)(pBVar10 + ((ulong)uVar53 - 1));
          do {
            puVar52 = puVar34;
            if ((BYTE)*puVar52 != (BYTE)*piVar26) goto LAB_0013fd32;
            pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
          } while ((piVar32 < piVar26) &&
                  (piVar26 = (int *)((long)piVar26 + -1), puVar34 = (ulong *)((long)puVar52 + -1),
                  local_150 < puVar52));
        }
      }
      else {
LAB_0013fc83:
        iVar22 = 0;
        uVar43 = (uint)local_130;
        puVar52 = puVar34;
      }
      goto LAB_0013fd44;
    }
    goto LAB_00142fdb;
  }
  puVar33 = (ulong *)(pBVar9 + uVar53);
  if (*puVar33 != uVar54) goto LAB_0013fc83;
  puVar39 = (ulong *)((long)puVar34 + 9);
  puVar41 = puVar33 + 1;
  puVar40 = puVar39;
  if (puVar39 < puVar1) {
    uVar42 = *puVar39 ^ *puVar41;
    uVar54 = 0;
    if (uVar42 != 0) {
      for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
      }
    }
    pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
    if (*puVar41 == *puVar39) {
      puVar40 = (ulong *)((long)puVar34 + 0x11);
      puVar41 = puVar33 + 2;
      do {
        if (puVar1 <= puVar40) goto LAB_0013fc92;
        uVar54 = *puVar41;
        uVar42 = *puVar40;
        uVar46 = uVar42 ^ uVar54;
        uVar44 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
          }
        }
        pBVar48 = (BYTE *)((long)puVar40 + ((uVar44 >> 3 & 0x1fffffff) - (long)puVar39));
        puVar40 = puVar40 + 1;
        puVar41 = puVar41 + 1;
      } while (uVar54 == uVar42);
    }
  }
  else {
LAB_0013fc92:
    if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
      puVar40 = (ulong *)((long)puVar40 + 4);
      puVar41 = (ulong *)((long)puVar41 + 4);
    }
    if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
      puVar40 = (ulong *)((long)puVar40 + 2);
      puVar41 = (ulong *)((long)puVar41 + 2);
    }
    if (puVar40 < iEnd) {
      puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40));
    }
    pBVar48 = (BYTE *)((long)puVar40 - (long)puVar39);
  }
  pZVar36 = (ZSTD_matchState_t *)(pBVar48 + 8);
  uVar43 = (int)puVar52 - (int)puVar33;
  iVar22 = 7;
  if ((uVar16 < uVar53) && (local_150 < puVar52)) {
    piVar26 = (int *)(pBVar5 + uVar53);
    do {
      puVar52 = puVar34;
      if ((BYTE)*puVar52 != (BYTE)*piVar26) goto LAB_0013fd32;
      pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
    } while ((iStart < piVar26) &&
            (piVar26 = (int *)((long)piVar26 + -1), puVar34 = (ulong *)((long)puVar52 + -1),
            local_150 < puVar52));
  }
  else {
LAB_0013fd2d:
    iVar22 = 7;
  }
LAB_0013fd44:
  if (iVar22 == 7) {
    local_130 = (BYTE *)(ulong)uVar43;
    goto LAB_0013ff1a;
  }
  if (iVar22 != 0) {
    local_130 = (BYTE *)(ulong)uVar43;
    goto LAB_001402f0;
  }
  puVar34 = (ulong *)((long)puVar52 + 4);
  puVar33 = (ulong *)(piVar25 + 1);
  if (local_70 < uVar16) {
    sVar24 = ZSTD_count_2segments
                       ((BYTE *)puVar34,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
    pZVar36 = (ZSTD_matchState_t *)(sVar24 + 4);
    local_130 = (BYTE *)(ulong)(UVar55 - local_70);
    if ((piVar32 < piVar25) && (local_150 < puVar52)) {
      puVar34 = (ulong *)((long)puVar52 + -1);
      do {
        piVar25 = (int *)((long)piVar25 + -1);
        if ((BYTE)*puVar34 != *(BYTE *)piVar25) goto LAB_0013ff0d;
        pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
        puVar52 = (ulong *)((long)puVar34 + -1);
      } while ((piVar32 < piVar25) && (bVar15 = local_150 < puVar34, puVar34 = puVar52, bVar15));
LAB_0013fa19:
      puVar52 = (ulong *)((long)puVar52 + 1);
    }
  }
  else {
    puVar39 = puVar34;
    if (puVar34 < puVar1) {
      uVar42 = *puVar34 ^ *puVar33;
      uVar54 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
        }
      }
      pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
      if (*puVar33 == *puVar34) {
        puVar39 = (ulong *)((long)puVar52 + 0xc);
        puVar33 = (ulong *)(piVar25 + 3);
        do {
          if (puVar1 <= puVar39) goto LAB_0013fe74;
          uVar54 = *puVar33;
          uVar42 = *puVar39;
          uVar46 = uVar42 ^ uVar54;
          uVar44 = 0;
          if (uVar46 != 0) {
            for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          pBVar48 = (BYTE *)((long)puVar39 + ((uVar44 >> 3 & 0x1fffffff) - (long)puVar34));
          puVar39 = puVar39 + 1;
          puVar33 = puVar33 + 1;
        } while (uVar54 == uVar42);
      }
    }
    else {
LAB_0013fe74:
      if ((puVar39 < puVar2) && ((int)*puVar33 == (int)*puVar39)) {
        puVar39 = (ulong *)((long)puVar39 + 4);
        puVar33 = (ulong *)((long)puVar33 + 4);
      }
      if ((puVar39 < puVar3) && ((short)*puVar33 == (short)*puVar39)) {
        puVar39 = (ulong *)((long)puVar39 + 2);
        puVar33 = (ulong *)((long)puVar33 + 2);
      }
      if (puVar39 < iEnd) {
        puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar39));
      }
      pBVar48 = (BYTE *)((long)puVar39 - (long)puVar34);
    }
    pZVar36 = (ZSTD_matchState_t *)(pBVar48 + 4);
    local_130 = (BYTE *)(ulong)(uint)((int)puVar52 - (int)piVar25);
    if ((iStart < piVar25) && (local_150 < puVar52)) {
      puVar34 = (ulong *)((long)puVar52 + -1);
      do {
        piVar25 = (int *)((long)piVar25 + -1);
        if ((BYTE)*puVar34 != *(BYTE *)piVar25) goto LAB_0013ff0d;
        pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
        puVar52 = (ulong *)((long)puVar34 + -1);
      } while ((iStart < piVar25) && (bVar15 = local_150 < puVar34, puVar34 = puVar52, bVar15));
      goto LAB_0013fa19;
    }
  }
LAB_0013ff1a:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00142ec4;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00142f21;
  uVar54 = (long)puVar52 - (long)local_150;
  puVar34 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar34 + uVar54)) goto LAB_00142ee3;
  if (iEnd < puVar52) goto LAB_00142f02;
  if (puVar23 < puVar52) {
    ZSTD_safecopyLiterals((BYTE *)puVar34,(BYTE *)local_150,(BYTE *)puVar52,(BYTE *)puVar23);
  }
  else {
    uVar42 = local_150[1];
    *puVar34 = *local_150;
    puVar34[1] = uVar42;
    if (0x10 < uVar54) {
      pBVar48 = seqStore->lit;
      puVar34 = (ulong *)(pBVar48 + 0x10);
      puVar33 = local_150 + 2;
      if (0xffffffffffffffe8 < (ulong)((long)puVar34 + (-8 - (long)puVar33))) goto LAB_00142f9d;
      if (0xffffffffffffffe0 < (ulong)((long)puVar34 + (-0x10 - (long)puVar33))) goto LAB_00142fbc;
      uVar42 = local_150[3];
      *puVar34 = *puVar33;
      *(ulong *)(pBVar48 + 0x18) = uVar42;
      if (0x20 < (long)uVar54) {
        lVar35 = 0;
        do {
          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x20);
          uVar17 = puVar7[1];
          pBVar4 = pBVar48 + lVar35 + 0x20;
          *(undefined8 *)pBVar4 = *puVar7;
          *(undefined8 *)(pBVar4 + 8) = uVar17;
          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x30);
          uVar17 = puVar7[1];
          *(undefined8 *)(pBVar4 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar4 + 0x18) = uVar17;
          lVar35 = lVar35 + 0x20;
        } while (pBVar4 + 0x20 < pBVar48 + uVar54);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar54;
  if (0xffff < uVar54) {
    if (seqStore->longLengthID != 0) goto LAB_00142f7e;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  puVar50 = &pZVar36[-1].field_0xd5;
  psVar28 = *ppsVar27;
  psVar28->litLength = (U16)uVar54;
  uVar53 = (uint)local_130;
  psVar28->offset = uVar53 + 3;
  local_144 = local_154;
  if ((undefined1 *)0xffff < puVar50) {
    local_154 = uVar53;
    if (seqStore->longLengthID != 0) goto LAB_00142f40;
LAB_0014006a:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
    uVar53 = local_154;
  }
LAB_00140090:
  local_154 = uVar53;
  psVar28->matchLength = (U16)puVar50;
  *ppsVar27 = psVar28 + 1;
  puVar52 = (ulong *)((long)puVar52 + (long)pZVar36);
  local_150 = puVar52;
  if (puVar52 <= puVar6) {
    uVar53 = UVar55 + 2;
    lVar35 = *(long *)(pBVar9 + uVar53);
    pUVar11[(ulong)(lVar35 * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] = uVar53;
    pUVar11[(ulong)(*(long *)((long)puVar52 + -2) * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] =
         ((int)puVar52 + -2) - iVar49;
    pUVar12[(ulong)(lVar35 * -0x30e44323405a9d00) >> (bVar30 & 0x3f)] = uVar53;
    pUVar12[(ulong)(*(long *)((long)puVar52 + -1) * -0x30e44323405a9d00) >> (bVar30 & 0x3f)] =
         ((int)puVar52 + -1) - iVar49;
    do {
      local_150 = puVar52;
      if (puVar6 < puVar52) break;
      UVar31 = (int)puVar52 - iVar49;
      uVar53 = UVar31 - local_144;
      pBVar48 = pBVar9;
      if (uVar53 < uVar16) {
        pBVar48 = pBVar10 + -uVar38;
      }
      if ((uVar53 - uVar16 < 0xfffffffd) && (*(int *)(pBVar48 + uVar53) == (int)*puVar52)) {
        puVar34 = iEnd;
        if (uVar53 < uVar16) {
          puVar34 = mEnd;
        }
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar48 + uVar53) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar34,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00142ec4;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00142f21;
        puVar34 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar34) goto LAB_00142ee3;
        if (iEnd < puVar52) goto LAB_00142f02;
        if (puVar23 < puVar52) {
          ZSTD_safecopyLiterals((BYTE *)puVar34,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar23);
        }
        else {
          uVar54 = puVar52[1];
          *puVar34 = *puVar52;
          puVar34[1] = uVar54;
        }
        psVar28 = seqStore->sequences;
        psVar28->litLength = 0;
        psVar28->offset = 1;
        if (0xffff < sVar24 + 1) {
          if (seqStore->longLengthID != 0) goto LAB_00142f40;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar28->matchLength = (U16)(sVar24 + 1);
        seqStore->sequences = psVar28 + 1;
        uVar54 = *puVar52;
        pUVar12[uVar54 * -0x30e44323405a9d00 >> (bVar30 & 0x3f)] = UVar31;
        pUVar11[uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f)] = UVar31;
        puVar52 = (ulong *)((long)puVar52 + sVar24 + 4);
        bVar15 = true;
        uVar53 = local_154;
        local_154 = local_144;
      }
      else {
        bVar15 = false;
        uVar53 = local_144;
      }
      local_144 = uVar53;
      local_150 = puVar52;
    } while (bVar15);
  }
LAB_001402f0:
  if (puVar6 <= puVar52) goto LAB_00142e93;
  goto LAB_0013f57d;
LAB_00140d8b:
  puVar52 = (ulong *)((long)puVar34 + 1);
LAB_00140d91:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00142ec4;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00142f21;
  uVar54 = (long)puVar52 - (long)local_150;
  puVar34 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar34 + uVar54)) goto LAB_00142ee3;
  if (iEnd < puVar52) goto LAB_00142f02;
  if (puVar23 < puVar52) {
    ZSTD_safecopyLiterals((BYTE *)puVar34,(BYTE *)local_150,(BYTE *)puVar52,(BYTE *)puVar23);
  }
  else {
    uVar42 = local_150[1];
    *puVar34 = *local_150;
    puVar34[1] = uVar42;
    if (0x10 < uVar54) {
      pBVar48 = seqStore->lit;
      puVar34 = (ulong *)(pBVar48 + 0x10);
      puVar33 = local_150 + 2;
      if (0xffffffffffffffe8 < (ulong)((long)puVar34 + (-8 - (long)puVar33))) goto LAB_00142f9d;
      if (0xffffffffffffffe0 < (ulong)((long)puVar34 + (-0x10 - (long)puVar33))) goto LAB_00142fbc;
      uVar42 = local_150[3];
      *puVar34 = *puVar33;
      *(ulong *)(pBVar48 + 0x18) = uVar42;
      if (0x20 < (long)uVar54) {
        lVar35 = 0;
        do {
          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x20);
          uVar17 = puVar7[1];
          pBVar4 = pBVar48 + lVar35 + 0x20;
          *(undefined8 *)pBVar4 = *puVar7;
          *(undefined8 *)(pBVar4 + 8) = uVar17;
          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x30);
          uVar17 = puVar7[1];
          *(undefined8 *)(pBVar4 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar4 + 0x18) = uVar17;
          lVar35 = lVar35 + 0x20;
        } while (pBVar4 + 0x20 < pBVar48 + uVar54);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar54;
  if (0xffff < uVar54) {
    if (seqStore->longLengthID != 0) goto LAB_00142f7e;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar48 = (BYTE *)((long)src + -3);
  psVar28 = *ppsVar27;
  psVar28->litLength = (U16)uVar54;
  uVar53 = (uint)local_108;
  psVar28->offset = uVar53 + 3;
  local_144 = local_154;
  if ((BYTE *)0xffff < pBVar48) {
    local_154 = uVar53;
    if (seqStore->longLengthID != 0) goto LAB_00142f40;
LAB_00140edd:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
    uVar53 = local_154;
  }
LAB_00140f03:
  local_154 = uVar53;
  psVar28->matchLength = (U16)pBVar48;
  *ppsVar27 = psVar28 + 1;
  puVar52 = (ulong *)((long)puVar52 + (long)src);
  local_150 = puVar52;
  if (puVar52 <= puVar6) {
    uVar53 = UVar55 + 2;
    lVar35 = *(long *)(pBVar9 + uVar53);
    pUVar11[(ulong)(lVar35 * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] = uVar53;
    pUVar11[(ulong)(*(long *)((long)puVar52 + -2) * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] =
         ((int)puVar52 + -2) - iVar49;
    pUVar12[(ulong)(lVar35 * -0x30e4432340650000) >> (bVar30 & 0x3f)] = uVar53;
    pUVar12[(ulong)(*(long *)((long)puVar52 + -1) * -0x30e4432340650000) >> (bVar30 & 0x3f)] =
         ((int)puVar52 + -1) - iVar49;
    do {
      local_150 = puVar52;
      if (puVar6 < puVar52) break;
      UVar31 = (int)puVar52 - iVar49;
      uVar53 = UVar31 - local_144;
      pBVar48 = pBVar9;
      if (uVar53 < uVar16) {
        pBVar48 = pBVar10 + -uVar38;
      }
      if ((uVar53 - uVar16 < 0xfffffffd) && (*(int *)(pBVar48 + uVar53) == (int)*puVar52)) {
        puVar34 = iEnd;
        if (uVar53 < uVar16) {
          puVar34 = mEnd;
        }
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar48 + uVar53) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar34,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00142ec4;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00142f21;
        puVar34 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar34) goto LAB_00142ee3;
        if (iEnd < puVar52) goto LAB_00142f02;
        if (puVar23 < puVar52) {
          ZSTD_safecopyLiterals((BYTE *)puVar34,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar23);
        }
        else {
          uVar54 = puVar52[1];
          *puVar34 = *puVar52;
          puVar34[1] = uVar54;
        }
        psVar28 = seqStore->sequences;
        psVar28->litLength = 0;
        psVar28->offset = 1;
        if (0xffff < sVar24 + 1) {
          if (seqStore->longLengthID != 0) goto LAB_00142f40;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar28->matchLength = (U16)(sVar24 + 1);
        seqStore->sequences = psVar28 + 1;
        uVar54 = *puVar52;
        pUVar12[uVar54 * -0x30e4432340650000 >> (bVar30 & 0x3f)] = UVar31;
        pUVar11[uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f)] = UVar31;
        puVar52 = (ulong *)((long)puVar52 + sVar24 + 4);
        bVar15 = true;
        uVar53 = local_154;
        local_154 = local_144;
      }
      else {
        bVar15 = false;
        uVar53 = local_144;
      }
      local_144 = uVar53;
      local_150 = puVar52;
    } while (bVar15);
  }
LAB_0014115d:
  if (puVar6 <= puVar52) goto LAB_00142e93;
  goto LAB_001403e0;
LAB_00142a6a:
  puVar52 = (ulong *)((long)puVar34 + 1);
LAB_00142a70:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00142ec4;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00142f21;
  uVar54 = (long)puVar52 - (long)local_150;
  puVar34 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar34 + uVar54)) goto LAB_00142ee3;
  if (iEnd < puVar52) goto LAB_00142f02;
  if (puVar23 < puVar52) {
    ZSTD_safecopyLiterals((BYTE *)puVar34,(BYTE *)local_150,(BYTE *)puVar52,(BYTE *)puVar23);
  }
  else {
    uVar42 = local_150[1];
    *puVar34 = *local_150;
    puVar34[1] = uVar42;
    if (0x10 < uVar54) {
      pBVar48 = seqStore->lit;
      puVar34 = (ulong *)(pBVar48 + 0x10);
      puVar33 = local_150 + 2;
      if (0xffffffffffffffe8 < (ulong)((long)puVar34 + (-8 - (long)puVar33))) goto LAB_00142f9d;
      if (0xffffffffffffffe0 < (ulong)((long)puVar34 + (-0x10 - (long)puVar33))) goto LAB_00142fbc;
      uVar42 = local_150[3];
      *puVar34 = *puVar33;
      *(ulong *)(pBVar48 + 0x18) = uVar42;
      if (0x20 < (long)uVar54) {
        lVar35 = 0;
        do {
          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x20);
          uVar17 = puVar7[1];
          pBVar4 = pBVar48 + lVar35 + 0x20;
          *(undefined8 *)pBVar4 = *puVar7;
          *(undefined8 *)(pBVar4 + 8) = uVar17;
          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x30);
          uVar17 = puVar7[1];
          *(undefined8 *)(pBVar4 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar4 + 0x18) = uVar17;
          lVar35 = lVar35 + 0x20;
        } while (pBVar4 + 0x20 < pBVar48 + uVar54);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar54;
  if (0xffff < uVar54) {
    if (seqStore->longLengthID != 0) goto LAB_00142f7e;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  puVar50 = &pZVar36[-1].field_0xd5;
  psVar28 = *ppsVar27;
  psVar28->litLength = (U16)uVar54;
  uVar53 = (uint)local_130;
  psVar28->offset = uVar53 + 3;
  if (puVar50 < (undefined1 *)0x10000) {
    local_144 = local_154;
    local_154 = uVar53;
  }
  else {
    local_144 = local_154;
    local_154 = uVar53;
    if (seqStore->longLengthID != 0) goto LAB_00142f40;
LAB_00142be9:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00142c10:
  psVar28->matchLength = (U16)puVar50;
  *ppsVar27 = psVar28 + 1;
  puVar52 = (ulong *)((long)puVar52 + (long)pZVar36);
  local_150 = puVar52;
  if (puVar52 <= puVar6) {
    uVar53 = UVar55 + 2;
    pUVar11[(ulong)(*(long *)(pBVar9 + uVar53) * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] = uVar53;
    pUVar11[(ulong)(*(long *)((long)puVar52 + -2) * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] =
         ((int)puVar52 + -2) - iVar49;
    pUVar12[(uint)(*(int *)(pBVar9 + uVar53) * -0x61c8864f) >> (bVar30 & 0x1f)] = uVar53;
    pUVar12[(uint)(*(int *)((long)puVar52 + -1) * -0x61c8864f) >> (bVar30 & 0x1f)] =
         ((int)puVar52 + -1) - iVar49;
    do {
      local_150 = puVar52;
      if (puVar6 < puVar52) break;
      UVar31 = (int)puVar52 - iVar49;
      uVar53 = UVar31 - local_144;
      pBVar48 = pBVar9;
      if (uVar53 < uVar16) {
        pBVar48 = pBVar10 + -uVar38;
      }
      if ((uVar53 - uVar16 < 0xfffffffd) && (*(int *)(pBVar48 + uVar53) == (int)*puVar52)) {
        puVar34 = iEnd;
        if (uVar53 < uVar16) {
          puVar34 = mEnd;
        }
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar48 + uVar53) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar34,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00142ec4;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00142f21;
        puVar34 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar34) goto LAB_00142ee3;
        if (iEnd < puVar52) goto LAB_00142f02;
        if (puVar23 < puVar52) {
          ZSTD_safecopyLiterals((BYTE *)puVar34,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar23);
        }
        else {
          uVar54 = puVar52[1];
          *puVar34 = *puVar52;
          puVar34[1] = uVar54;
        }
        psVar28 = seqStore->sequences;
        psVar28->litLength = 0;
        psVar28->offset = 1;
        if (0xffff < sVar24 + 1) {
          if (seqStore->longLengthID != 0) goto LAB_00142f40;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar28->matchLength = (U16)(sVar24 + 1);
        seqStore->sequences = psVar28 + 1;
        pUVar12[(uint)((int)*puVar52 * -0x61c8864f) >> (bVar30 & 0x1f)] = UVar31;
        pUVar11[*puVar52 * -0x30e44323485a9b9d >> (bVar29 & 0x3f)] = UVar31;
        puVar52 = (ulong *)((long)puVar52 + sVar24 + 4);
        bVar15 = true;
        uVar53 = local_154;
        local_154 = local_144;
      }
      else {
        bVar15 = false;
        uVar53 = local_144;
      }
      local_144 = uVar53;
      local_150 = puVar52;
    } while (bVar15);
  }
LAB_00142e6e:
  if (puVar6 <= puVar52) goto LAB_00142e93;
  goto LAB_001420dd;
LAB_0013fd32:
  iVar22 = 7;
  puVar52 = (ulong *)((long)puVar52 + 1);
  goto LAB_0013fd44;
LAB_0013ff0d:
  puVar52 = (ulong *)((long)puVar34 + 1);
  goto LAB_0013ff1a;
LAB_00141a22:
  iVar22 = 7;
  puVar52 = (ulong *)((long)puVar52 + 1);
LAB_00141a34:
  if (iVar22 == 7) {
    local_130 = (BYTE *)(ulong)uVar43;
  }
  else {
    if (iVar22 != 0) {
      local_130 = (BYTE *)(ulong)uVar43;
      goto LAB_00141fe0;
    }
    puVar34 = (ulong *)((long)puVar52 + 4);
    puVar33 = (ulong *)(piVar25 + 1);
    if (local_70 < uVar16) {
      sVar24 = ZSTD_count_2segments
                         ((BYTE *)puVar34,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      pZVar36 = (ZSTD_matchState_t *)(sVar24 + 4);
      local_130 = (BYTE *)(ulong)(UVar55 - local_70);
      if ((piVar32 < piVar25) && (local_150 < puVar52)) {
        puVar34 = (ulong *)((long)puVar52 + -1);
        do {
          piVar25 = (int *)((long)piVar25 + -1);
          if ((BYTE)*puVar34 != *(BYTE *)piVar25) goto LAB_00141bfd;
          pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
          puVar52 = (ulong *)((long)puVar34 + -1);
        } while ((piVar32 < piVar25) && (bVar15 = local_150 < puVar34, puVar34 = puVar52, bVar15));
LAB_00141709:
        puVar52 = (ulong *)((long)puVar52 + 1);
      }
    }
    else {
      puVar39 = puVar34;
      if (puVar34 < puVar1) {
        uVar42 = *puVar34 ^ *puVar33;
        uVar54 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
          }
        }
        pBVar48 = (BYTE *)(uVar54 >> 3 & 0x1fffffff);
        if (*puVar33 == *puVar34) {
          puVar39 = (ulong *)((long)puVar52 + 0xc);
          puVar33 = (ulong *)(piVar25 + 3);
          do {
            if (puVar1 <= puVar39) goto LAB_00141b64;
            uVar54 = *puVar33;
            uVar42 = *puVar39;
            uVar46 = uVar42 ^ uVar54;
            uVar44 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            pBVar48 = (BYTE *)((long)puVar39 + ((uVar44 >> 3 & 0x1fffffff) - (long)puVar34));
            puVar39 = puVar39 + 1;
            puVar33 = puVar33 + 1;
          } while (uVar54 == uVar42);
        }
      }
      else {
LAB_00141b64:
        if ((puVar39 < puVar2) && ((int)*puVar33 == (int)*puVar39)) {
          puVar39 = (ulong *)((long)puVar39 + 4);
          puVar33 = (ulong *)((long)puVar33 + 4);
        }
        if ((puVar39 < puVar3) && ((short)*puVar33 == (short)*puVar39)) {
          puVar39 = (ulong *)((long)puVar39 + 2);
          puVar33 = (ulong *)((long)puVar33 + 2);
        }
        if (puVar39 < iEnd) {
          puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar39));
        }
        pBVar48 = (BYTE *)((long)puVar39 - (long)puVar34);
      }
      pZVar36 = (ZSTD_matchState_t *)(pBVar48 + 4);
      local_130 = (BYTE *)(ulong)(uint)((int)puVar52 - (int)piVar25);
      if ((iStart < piVar25) && (local_150 < puVar52)) {
        puVar34 = (ulong *)((long)puVar52 + -1);
        do {
          piVar25 = (int *)((long)piVar25 + -1);
          if ((BYTE)*puVar34 != *(BYTE *)piVar25) goto LAB_00141bfd;
          pZVar36 = (ZSTD_matchState_t *)((long)&(pZVar36->window).nextSrc + 1);
          puVar52 = (ulong *)((long)puVar34 + -1);
        } while ((iStart < piVar25) && (bVar15 = local_150 < puVar34, puVar34 = puVar52, bVar15));
        goto LAB_00141709;
      }
    }
  }
LAB_00141c0a:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_00142ec4:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2038,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_00142f21:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203a,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar54 = (long)puVar52 - (long)local_150;
  puVar34 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar34 + uVar54)) {
LAB_00142ee3:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (iEnd < puVar52) {
LAB_00142f02:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203c,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar23 < puVar52) {
    ZSTD_safecopyLiterals((BYTE *)puVar34,(BYTE *)local_150,(BYTE *)puVar52,(BYTE *)puVar23);
  }
  else {
    uVar42 = local_150[1];
    *puVar34 = *local_150;
    puVar34[1] = uVar42;
    if (0x10 < uVar54) {
      pBVar48 = seqStore->lit;
      puVar34 = (ulong *)(pBVar48 + 0x10);
      puVar33 = local_150 + 2;
      if (0xffffffffffffffe8 < (ulong)((long)puVar34 + (-8 - (long)puVar33))) {
LAB_00142f9d:
        __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1268,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      if (0xffffffffffffffe0 < (ulong)((long)puVar34 + (-0x10 - (long)puVar33))) {
LAB_00142fbc:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1270,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar42 = local_150[3];
      *puVar34 = *puVar33;
      *(ulong *)(pBVar48 + 0x18) = uVar42;
      if (0x20 < (long)uVar54) {
        lVar35 = 0;
        do {
          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x20);
          uVar17 = puVar7[1];
          pBVar4 = pBVar48 + lVar35 + 0x20;
          *(undefined8 *)pBVar4 = *puVar7;
          *(undefined8 *)(pBVar4 + 8) = uVar17;
          puVar7 = (undefined8 *)((long)local_150 + lVar35 + 0x30);
          uVar17 = puVar7[1];
          *(undefined8 *)(pBVar4 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar4 + 0x18) = uVar17;
          lVar35 = lVar35 + 0x20;
        } while (pBVar4 + 0x20 < pBVar48 + uVar54);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar54;
  if (0xffff < uVar54) {
    if (seqStore->longLengthID != 0) {
LAB_00142f7e:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x204d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  puVar50 = &pZVar36[-1].field_0xd5;
  psVar28 = *ppsVar27;
  psVar28->litLength = (U16)uVar54;
  uVar53 = (uint)local_130;
  psVar28->offset = uVar53 + 3;
  local_144 = local_154;
  if ((undefined1 *)0xffff < puVar50) {
    local_154 = uVar53;
    if (seqStore->longLengthID != 0) {
LAB_00142f40:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2058,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
LAB_00141d5a:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
    uVar53 = local_154;
  }
LAB_00141d80:
  local_154 = uVar53;
  psVar28->matchLength = (U16)puVar50;
  *ppsVar27 = psVar28 + 1;
  puVar52 = (ulong *)((long)puVar52 + (long)pZVar36);
  local_150 = puVar52;
  if (puVar52 <= puVar6) {
    uVar53 = UVar55 + 2;
    lVar35 = *(long *)(pBVar9 + uVar53);
    pUVar11[(ulong)(lVar35 * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] = uVar53;
    pUVar11[(ulong)(*(long *)((long)puVar52 + -2) * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] =
         ((int)puVar52 + -2) - iVar49;
    pUVar12[(ulong)(lVar35 * -0x30e4432345000000) >> (bVar30 & 0x3f)] = uVar53;
    pUVar12[(ulong)(*(long *)((long)puVar52 + -1) * -0x30e4432345000000) >> (bVar30 & 0x3f)] =
         ((int)puVar52 + -1) - iVar49;
    do {
      local_150 = puVar52;
      if (puVar6 < puVar52) break;
      UVar31 = (int)puVar52 - iVar49;
      uVar53 = UVar31 - local_144;
      pBVar48 = pBVar9;
      if (uVar53 < uVar16) {
        pBVar48 = pBVar10 + -uVar38;
      }
      if ((uVar53 - uVar16 < 0xfffffffd) && (*(int *)(pBVar48 + uVar53) == (int)*puVar52)) {
        puVar34 = iEnd;
        if (uVar53 < uVar16) {
          puVar34 = mEnd;
        }
        sVar24 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar48 + uVar53) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar34,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00142ec4;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00142f21;
        puVar34 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar34) goto LAB_00142ee3;
        if (iEnd < puVar52) goto LAB_00142f02;
        if (puVar23 < puVar52) {
          ZSTD_safecopyLiterals((BYTE *)puVar34,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar23);
        }
        else {
          uVar54 = puVar52[1];
          *puVar34 = *puVar52;
          puVar34[1] = uVar54;
        }
        psVar28 = seqStore->sequences;
        psVar28->litLength = 0;
        psVar28->offset = 1;
        if (0xffff < sVar24 + 1) {
          if (seqStore->longLengthID != 0) goto LAB_00142f40;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar28->matchLength = (U16)(sVar24 + 1);
        seqStore->sequences = psVar28 + 1;
        uVar54 = *puVar52;
        pUVar12[uVar54 * -0x30e4432345000000 >> (bVar30 & 0x3f)] = UVar31;
        pUVar11[uVar54 * -0x30e44323485a9b9d >> (bVar29 & 0x3f)] = UVar31;
        puVar52 = (ulong *)((long)puVar52 + sVar24 + 4);
        bVar15 = true;
        uVar53 = local_154;
        local_154 = local_144;
      }
      else {
        bVar15 = false;
        uVar53 = local_144;
      }
      local_144 = uVar53;
      local_150 = puVar52;
    } while (bVar15);
  }
LAB_00141fe0:
  if (puVar6 <= puVar52) goto LAB_00142e93;
  goto LAB_0014126d;
LAB_00141bfd:
  puVar52 = (ulong *)((long)puVar34 + 1);
  goto LAB_00141c0a;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}